

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O2

void __thiscall Quat4f::invert(Quat4f *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  float fVar4;
  float local_18;
  float fStack_14;
  
  fVar1 = this->m_elements[1];
  uVar2 = *(undefined8 *)(this->m_elements + 2);
  uVar3 = *(undefined8 *)this->m_elements;
  fVar4 = absSquared(this);
  fVar4 = 1.0 / fVar4;
  local_18 = (float)uVar2;
  fStack_14 = (float)((ulong)uVar2 >> 0x20);
  this->m_elements[0] = fVar4 * (float)uVar3;
  this->m_elements[1] = fVar4 * -fVar1;
  this->m_elements[2] = fVar4 * -local_18;
  this->m_elements[3] = fVar4 * -fStack_14;
  return;
}

Assistant:

void Quat4f::invert()
{
	Quat4f inverse = conjugated() * ( 1.0f / absSquared() );

	m_elements[ 0 ] = inverse.m_elements[ 0 ];
	m_elements[ 1 ] = inverse.m_elements[ 1 ];
	m_elements[ 2 ] = inverse.m_elements[ 2 ];
	m_elements[ 3 ] = inverse.m_elements[ 3 ];
}